

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O2

void Abc_NodeEdgeDsdPushOrdered(Dec_Graph_t *pGraph,Vec_Int_t *vEdges,int Edge)

{
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = vEdges->nSize;
  uVar3 = (ulong)uVar1;
  vEdges->nSize = uVar1 + 1;
  piVar2 = vEdges->pArray;
  while ((uVar4 = (int)uVar1 >> 0x1f & uVar1, 0 < (int)(uint)uVar3 &&
         (uVar4 = (uint)uVar3,
         (*(uint *)&pGraph->pNodes[(uint)piVar2[uVar3 - 1] >> 1 & 0x3fffffff].field_0x10 & 0x3fff)
         <= (*(uint *)&pGraph->pNodes[(uint)Edge >> 1 & 0x3fffffff].field_0x10 & 0x3fff)))) {
    piVar2[uVar3] = piVar2[uVar3 - 1];
    uVar3 = uVar3 - 1;
  }
  piVar2[(int)uVar4] = Edge;
  return;
}

Assistant:

void Abc_NodeEdgeDsdPushOrdered( Dec_Graph_t * pGraph, Vec_Int_t * vEdges, int Edge )
{
    int i, NodeOld, NodeNew;
    vEdges->nSize++;
    for ( i = vEdges->nSize-2; i >= 0; i-- )
    {
        NodeOld = Dec_IntToEdge(vEdges->pArray[i]).Node;
        NodeNew = Dec_IntToEdge(Edge).Node;
        // use <= because we are trying to push the new (non-existent) nodes as far as possible
        if ( Dec_GraphNode(pGraph, NodeOld)->Level <= Dec_GraphNode(pGraph, NodeNew)->Level )
            vEdges->pArray[i+1] = vEdges->pArray[i];
        else
            break;
    }
    vEdges->pArray[i+1] = Edge;
}